

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u32.cpp
# Opt level: O1

void T_UConverter_fromUnicode_UTF32_LE(UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  uchar uVar1;
  char cVar2;
  UChar *pUVar3;
  uchar *targetLimit;
  UConverter *pUVar4;
  uchar *puVar5;
  uint uVar6;
  long lVar7;
  UChar *pUVar8;
  uchar temp [4];
  
  pUVar8 = args->source;
  pUVar3 = args->sourceLimit;
  if (pUVar8 < pUVar3) {
    targetLimit = (uchar *)args->targetLimit;
    if (args->converter->fromUnicodeStatus == 1) {
      ucnv_fromUWriteBytes_63
                (args->converter,T_UConverter_fromUnicode_UTF32_LE::bom,4,&args->target,
                 (char *)targetLimit,&args->offsets,-1,err);
      args->converter->fromUnicodeStatus = 0;
    }
    puVar5 = (uchar *)args->target;
    temp[3] = '\0';
    uVar6 = args->converter->fromUChar32;
    if (uVar6 == 0) goto LAB_00168d70;
    args->converter->fromUChar32 = 0;
    do {
      if (pUVar3 <= pUVar8) {
        args->converter->fromUChar32 = uVar6;
        if (args->flush == '\0') goto LAB_00168e41;
        goto LAB_00168e3a;
      }
      if (((ushort)*pUVar8 & 0xfc00) != 0xdc00) break;
      uVar6 = uVar6 * 0x400 + (uint)(ushort)*pUVar8 + 0xfca02400;
      pUVar8 = pUVar8 + 1;
      do {
        temp[2] = (byte)(uVar6 >> 0x10) & 0x1f;
        temp[1] = (uchar)(uVar6 >> 8);
        temp[0] = (uchar)uVar6;
        lVar7 = 0;
        do {
          uVar1 = temp[lVar7];
          if (puVar5 < targetLimit) {
            *puVar5 = uVar1;
            puVar5 = puVar5 + 1;
          }
          else {
            pUVar4 = args->converter;
            cVar2 = pUVar4->charErrorBufferLength;
            pUVar4->charErrorBufferLength = cVar2 + '\x01';
            pUVar4->charErrorBuffer[cVar2] = uVar1;
            *err = U_BUFFER_OVERFLOW_ERROR;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
LAB_00168d70:
        if ((pUVar3 <= pUVar8) || (targetLimit <= puVar5)) goto LAB_00168e41;
        uVar6 = (uint)(ushort)*pUVar8;
        pUVar8 = pUVar8 + 1;
      } while ((uVar6 & 0xf800) != 0xd800);
    } while ((uVar6 & 0xdc00) == 0xd800);
    args->converter->fromUChar32 = uVar6;
LAB_00168e3a:
    *err = U_ILLEGAL_CHAR_FOUND;
LAB_00168e41:
    if (((pUVar8 < pUVar3) && (targetLimit <= puVar5)) && (*err < U_ILLEGAL_ARGUMENT_ERROR)) {
      *err = U_BUFFER_OVERFLOW_ERROR;
    }
    args->target = (char *)puVar5;
    args->source = pUVar8;
  }
  return;
}

Assistant:

static void U_CALLCONV
T_UConverter_fromUnicode_UTF32_LE(UConverterFromUnicodeArgs * args,
                                  UErrorCode * err)
{
    const UChar *mySource = args->source;
    unsigned char *myTarget;
    const UChar *sourceLimit = args->sourceLimit;
    const unsigned char *targetLimit = (unsigned char *) args->targetLimit;
    UChar32 ch, ch2;
    unsigned int indexToWrite;
    unsigned char temp[sizeof(uint32_t)];

    if(mySource >= sourceLimit) {
        /* no input, nothing to do */
        return;
    }

    /* write the BOM if necessary */
    if(args->converter->fromUnicodeStatus==UCNV_NEED_TO_WRITE_BOM) {
        static const char bom[]={ (char)0xffu, (char)0xfeu, 0, 0 };
        ucnv_fromUWriteBytes(args->converter,
                             bom, 4,
                             &args->target, args->targetLimit,
                             &args->offsets, -1,
                             err);
        args->converter->fromUnicodeStatus=0;
    }

    myTarget = (unsigned char *) args->target;
    temp[3] = 0;

    if (args->converter->fromUChar32)
    {
        ch = args->converter->fromUChar32;
        args->converter->fromUChar32 = 0;
        goto lowsurogate;
    }

    while (mySource < sourceLimit && myTarget < targetLimit)
    {
        ch = *(mySource++);

        if (U16_IS_SURROGATE(ch)) {
            if (U16_IS_LEAD(ch))
            {
lowsurogate:
                if (mySource < sourceLimit)
                {
                    ch2 = *mySource;
                    if (U16_IS_TRAIL(ch2)) {
                        ch = ((ch - SURROGATE_HIGH_START) << HALF_SHIFT) + ch2 + SURROGATE_LOW_BASE;
                        mySource++;
                    }
                    else {
                        /* this is an unmatched trail code unit (2nd surrogate) */
                        /* callback(illegal) */
                        args->converter->fromUChar32 = ch;
                        *err = U_ILLEGAL_CHAR_FOUND;
                        break;
                    }
                }
                else {
                    /* ran out of source */
                    args->converter->fromUChar32 = ch;
                    if (args->flush) {
                        /* this is an unmatched trail code unit (2nd surrogate) */
                        /* callback(illegal) */
                        *err = U_ILLEGAL_CHAR_FOUND;
                    }
                    break;
                }
            }
            else {
                /* this is an unmatched trail code unit (2nd surrogate) */
                /* callback(illegal) */
                args->converter->fromUChar32 = ch;
                *err = U_ILLEGAL_CHAR_FOUND;
                break;
            }
        }

        /* We cannot get any larger than 10FFFF because we are coming from UTF-16 */
        temp[2] = (uint8_t) (ch >> 16 & 0x1F);
        temp[1] = (uint8_t) (ch >> 8);  /* unsigned cast implicitly does (ch & FF) */
        temp[0] = (uint8_t) (ch);       /* unsigned cast implicitly does (ch & FF) */

        for (indexToWrite = 0; indexToWrite <= sizeof(uint32_t) - 1; indexToWrite++)
        {
            if (myTarget < targetLimit)
            {
                *(myTarget++) = temp[indexToWrite];
            }
            else
            {
                args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = temp[indexToWrite];
                *err = U_BUFFER_OVERFLOW_ERROR;
            }
        }
    }

    if (mySource < sourceLimit && myTarget >= targetLimit && U_SUCCESS(*err))
    {
        *err = U_BUFFER_OVERFLOW_ERROR;
    }

    args->target = (char *) myTarget;
    args->source = mySource;
}